

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O1

int ConnectIM483I(IM483I *pIM483I,char *szCfgFilePath)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ssize_t sVar5;
  int iVar6;
  uint uVar7;
  void *__buf;
  int Bytes;
  char line [256];
  char recvbuf [512];
  char local_5a8;
  char local_5a7;
  int *local_4a0;
  BOOL *local_498;
  int *local_490;
  BOOL *local_488;
  int *local_480;
  int *local_478;
  int *local_470;
  int *local_468;
  int *local_460;
  int *local_458;
  int *local_450;
  double *local_448;
  undefined8 local_440;
  timespec local_438 [32];
  uint8 local_238 [520];
  
  memset(pIM483I->szCfgFilePath,0,0x100);
  sprintf(pIM483I->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar2 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar2 != 0) {
    memset(&local_5a8,0,0x100);
    memset(pIM483I->szDevPath + 5,0,0xfb);
    builtin_strncpy(pIM483I->szDevPath,"COM1",5);
    pIM483I->BaudRate = 0x12c0;
    pIM483I->timeout = 1000;
    pIM483I->threadperiod = 0x32;
    pIM483I->bSaveRawData = 1;
    pIM483I->bytedelayus = -1;
    pIM483I->bCheckState = 0;
    pIM483I->CalibrationSpeed = 2000;
    pIM483I->CalibrationTime = 65000;
    pIM483I->CalibrationHoldTorque = 1;
    pIM483I->CalibrationRunTorque = 0x3c;
    pIM483I->NormalHoldTorque = 1;
    pIM483I->NormalRunTorque = 100;
    pIM483I->ThresholdRval = 0;
    pIM483I->MinAngle = 0.0;
    pIM483I->MaxAngle = 1.5707963267948966;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar3 = "Configuration file not found.";
    }
    else {
      local_4a0 = &pIM483I->threadperiod;
      local_498 = &pIM483I->bSaveRawData;
      local_490 = &pIM483I->bytedelayus;
      local_488 = &pIM483I->bCheckState;
      local_480 = &pIM483I->CalibrationSpeed;
      local_478 = &pIM483I->CalibrationTime;
      local_470 = &pIM483I->CalibrationHoldTorque;
      local_468 = &pIM483I->CalibrationRunTorque;
      local_460 = &pIM483I->NormalHoldTorque;
      local_458 = &pIM483I->NormalRunTorque;
      local_450 = &pIM483I->ThresholdRval;
      local_448 = &pIM483I->MinAngle;
      local_440 = &pIM483I->MaxAngle;
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011afdc;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011afdc:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%255s",pIM483I->szDevPath);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b05b;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b05b:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",&pIM483I->BaudRate);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b0da;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b0da:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",&pIM483I->timeout);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b159;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b159:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_4a0);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b1dd;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b1dd:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_498);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b261;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b261:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_490);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b2e5;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b2e5:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_488);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b369;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b369:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_480);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b3ed;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b3ed:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_478);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b471;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b471:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_470);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b4f5;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b4f5:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_468);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b579;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b579:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_460);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b5fd;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b5fd:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_458);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b681;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b681:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%d",local_450);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b705;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b705:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%lf",local_448);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar3 = fgets(&local_5a8,0x100,__stream), local_5a8 != '#' && (local_5a8 != '%')))
        {
          if ((local_5a8 != '/') || ((pcVar3 == (char *)0x0 || (local_5a7 != '/'))))
          goto LAB_0011b789;
        }
      } while (pcVar3 != (char *)0x0);
LAB_0011b789:
      if (pcVar3 == (char *)0x0 || local_5a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar2 = __isoc99_sscanf(&local_5a8,"%lf",local_440);
      if (iVar2 != 1) {
        puts("Invalid configuration file.");
      }
      iVar2 = fclose(__stream);
      if (iVar2 == 0) goto LAB_0011b7f2;
      pcVar3 = "fclose() failed.";
    }
    puts(pcVar3);
  }
LAB_0011b7f2:
  if (pIM483I->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pIM483I->threadperiod = 0x32;
  }
  iVar2 = pIM483I->CalibrationSpeed;
  iVar6 = -iVar2;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  if (iVar6 - 0x4e21U < 0xffffb1f3) {
    puts("Invalid parameter : CalibrationSpeed.");
    pIM483I->CalibrationSpeed = 2000;
  }
  if (600000 < (uint)pIM483I->CalibrationTime) {
    puts("Invalid parameter : CalibrationTime.");
    pIM483I->CalibrationTime = 65000;
  }
  if (100 < (uint)pIM483I->CalibrationHoldTorque) {
    puts("Invalid parameter : CalibrationHoldTorque.");
    pIM483I->CalibrationHoldTorque = 1;
  }
  if (100 < (uint)pIM483I->CalibrationRunTorque) {
    puts("Invalid parameter : CalibrationRunTorque.");
    pIM483I->CalibrationRunTorque = 0x3c;
  }
  if (100 < (uint)pIM483I->NormalHoldTorque) {
    puts("Invalid parameter : NormalHoldTorque.");
    pIM483I->NormalHoldTorque = 1;
  }
  if (100 < (uint)pIM483I->NormalRunTorque) {
    puts("Invalid parameter : NormalRunTorque.");
    pIM483I->NormalRunTorque = 100;
  }
  pIM483I->LastRval = 0x2000004;
  iVar2 = OpenRS232Port(&pIM483I->RS232Port,pIM483I->szDevPath);
  if (iVar2 != 0) {
    puts("Unable to connect to a IM483I.");
    return 1;
  }
  iVar2 = (pIM483I->RS232Port).DevType;
  if (3 < iVar2 - 1U) {
    if ((iVar2 != 0) ||
       (iVar2 = SetOptionsComputerRS232Port
                          ((pIM483I->RS232Port).hDev,pIM483I->BaudRate,'\0',0,'\b','\0',
                           pIM483I->timeout), iVar2 != 0)) goto LAB_0011ba8e;
    tcflush(*(int *)&(pIM483I->RS232Port).hDev,2);
  }
  memset(local_238 + 3,0,0x1fd);
  local_238[0] = ' ';
  local_238[1] = '\r';
  local_238[2] = 0;
  sVar4 = strlen((char *)local_238);
  iVar2 = WriteDataIM483I(pIM483I,local_238,(int)sVar4,pIM483I->bytedelayus);
  if (iVar2 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(long)(int)sVar4,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    local_438[0].tv_sec = 0;
    local_438[0].tv_nsec = 100000000;
    sVar5 = 0;
    nanosleep(local_438,(timespec *)0x0);
    if (pIM483I->bCheckState == 0) {
LAB_0011bb02:
      puts("IM483I connected.");
      return 0;
    }
    memset(local_438,0,0x200);
    uVar7 = 0;
    while( true ) {
      if ((0 < (int)uVar7) && (*(char *)((long)&local_440 + (ulong)uVar7 + 7) == '#')) {
        if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
          fwrite(local_438,0x1ff,1,(FILE *)pIM483I->pfSaveFile);
          fflush((FILE *)pIM483I->pfSaveFile);
        }
        goto LAB_0011bb02;
      }
      if (0x1fe < (int)uVar7) break;
      __buf = (void *)((long)&local_438[0].tv_sec + (long)(int)uVar7);
      iVar2 = (pIM483I->RS232Port).DevType;
      if (iVar2 - 1U < 4) {
        sVar5 = recv((pIM483I->RS232Port).s,__buf,1,0);
LAB_0011ba4b:
        bVar1 = (int)sVar5 < 1;
      }
      else {
        bVar1 = true;
        if (iVar2 == 0) {
          sVar5 = read(*(int *)&(pIM483I->RS232Port).hDev,__buf,1);
          goto LAB_0011ba4b;
        }
      }
      if ((bVar1) || (uVar7 = uVar7 + (int)sVar5, (int)sVar5 == 0)) break;
    }
  }
LAB_0011ba8e:
  puts("Unable to connect to a IM483I.");
  CloseRS232Port(&pIM483I->RS232Port);
  return 1;
}

Assistant:

inline int ConnectIM483I(IM483I* pIM483I, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	memset(pIM483I->szCfgFilePath, 0, sizeof(pIM483I->szCfgFilePath));
	sprintf(pIM483I->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pIM483I->szDevPath, 0, sizeof(pIM483I->szDevPath));
		sprintf(pIM483I->szDevPath, "COM1");
		pIM483I->BaudRate = 4800;
		pIM483I->timeout = 1000;
		pIM483I->threadperiod = 50;
		pIM483I->bSaveRawData = 1;
		pIM483I->bytedelayus = -1;
		pIM483I->bCheckState = 0;
		pIM483I->CalibrationSpeed = CALIBRATION_SPEED_IM483I;
		pIM483I->CalibrationTime = CALIBRATION_TIME_IM483I;
		pIM483I->CalibrationHoldTorque = CALIBRATION_HOLD_TORQUE_IM483I;
		pIM483I->CalibrationRunTorque = CALIBRATION_RUN_TORQUE_IM483I;
		pIM483I->NormalHoldTorque = NORMAL_HOLD_TORQUE_IM483I;
		pIM483I->NormalRunTorque = NORMAL_RUN_TORQUE_IM483I;
		pIM483I->ThresholdRval = 0;
		pIM483I->MinAngle = MIN_ANGLE_IM483I;
		pIM483I->MaxAngle = MAX_ANGLE_IM483I;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pIM483I->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bytedelayus) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bCheckState) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationSpeed) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationTime) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationHoldTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationRunTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->NormalHoldTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->NormalRunTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->ThresholdRval) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pIM483I->MinAngle) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pIM483I->MaxAngle) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pIM483I->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pIM483I->threadperiod = 50;
	}
	if ((abs(pIM483I->CalibrationSpeed) < MIN_MOTOR_SPEED_IM483I)||(abs(pIM483I->CalibrationSpeed) > MAX_MOTOR_SPEED_IM483I))
	{
		printf("Invalid parameter : CalibrationSpeed.\n");
		pIM483I->CalibrationSpeed = CALIBRATION_SPEED_IM483I;
	}
	if ((pIM483I->CalibrationTime < 0)||(pIM483I->CalibrationTime > MAX_CALIBRATION_TIME_IM483I))
	{
		printf("Invalid parameter : CalibrationTime.\n");
		pIM483I->CalibrationTime = CALIBRATION_TIME_IM483I;
	}
	if ((pIM483I->CalibrationHoldTorque < 0)||(pIM483I->CalibrationHoldTorque > 100))
	{
		printf("Invalid parameter : CalibrationHoldTorque.\n");
		pIM483I->CalibrationHoldTorque = CALIBRATION_HOLD_TORQUE_IM483I;
	}
	if ((pIM483I->CalibrationRunTorque < 0)||(pIM483I->CalibrationRunTorque > 100))
	{
		printf("Invalid parameter : CalibrationRunTorque.\n");
		pIM483I->CalibrationRunTorque = CALIBRATION_RUN_TORQUE_IM483I;
	}
	if ((pIM483I->NormalHoldTorque < 0)||(pIM483I->NormalHoldTorque > 100))
	{
		printf("Invalid parameter : NormalHoldTorque.\n");
		pIM483I->NormalHoldTorque = NORMAL_HOLD_TORQUE_IM483I;
	}
	if ((pIM483I->NormalRunTorque < 0)||(pIM483I->NormalRunTorque > 100))
	{
		printf("Invalid parameter : NormalRunTorque.\n");
		pIM483I->NormalRunTorque = NORMAL_RUN_TORQUE_IM483I;
	}

	// Used to save raw data, should be handled specifically...
	//pIM483I->pfSaveFile = NULL;

	pIM483I->LastRval = 4*((int)MAX_INDEX_IM483I+2);

	if (OpenRS232Port(&pIM483I->RS232Port, pIM483I->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pIM483I->RS232Port, pIM483I->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pIM483I->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		CloseRS232Port(&pIM483I->RS232Port);
		return EXIT_FAILURE;
	}

	// Initialization.
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, " \r");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		CloseRS232Port(&pIM483I->RS232Port);
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(100);

	if (pIM483I->bCheckState)
	{
		// Should reply 
		// "xxxx xxxx ADVANCED MICRO SYSTEMS, INC\r\nMAX-2000 vX.XXi\r\n#"...
		// e.g.
		// "     4038 ADVANCED MICRO SYSTEMS, INC\r\nMAX-2000 v1.15i\r\n#"...
		// If already initialized
		// " #"?

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sizeof(recvbuf)-1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadUntilRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, '#', recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a IM483I.\n");
			CloseRS232Port(&pIM483I->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
	}

	printf("IM483I connected.\n");

	return EXIT_SUCCESS;
}